

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

BrotliDecoderErrorCode
duckdb_brotli::WriteRingBuffer
          (BrotliDecoderStateInternal *s,size_t *available_out,uint8_t **next_out,size_t *total_out,
          int force)

{
  int iVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  BrotliDecoderErrorCode BVar8;
  size_t sVar9;
  
  iVar1 = s->ringbuffer_mask;
  uVar2 = s->partial_pos_out;
  puVar3 = s->ringbuffer;
  BVar8 = BROTLI_DECODER_SUCCESS;
  sVar5 = UnwrittenBytes(s,1);
  uVar4 = *available_out;
  sVar9 = sVar5;
  if (uVar4 < sVar5) {
    sVar9 = uVar4;
  }
  if (s->meta_block_remaining_len < 0) {
    BVar8 = BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1;
  }
  else {
    uVar6 = uVar4;
    if (next_out != (uint8_t **)0x0) {
      if (*next_out == (uint8_t *)0x0) {
        *next_out = puVar3 + ((long)iVar1 & uVar2);
      }
      else {
        switchD_0036ec8a::default(*next_out,puVar3 + ((long)iVar1 & uVar2),sVar9);
        *next_out = *next_out + sVar9;
        uVar6 = *available_out;
      }
    }
    *available_out = uVar6 - sVar9;
    sVar9 = sVar9 + s->partial_pos_out;
    s->partial_pos_out = sVar9;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar9;
    }
    iVar7 = 1 << ((byte)(*(uint *)&s->field_0x304 >> 6) & 0x1f);
    iVar1 = s->ringbuffer_size;
    if (uVar4 < sVar5) {
      BVar8 = BROTLI_DECODER_NEEDS_MORE_OUTPUT;
      if (force == 0) {
        BVar8 = (uint)(iVar1 == iVar7) * 2 + BROTLI_DECODER_SUCCESS;
      }
    }
    else if (iVar1 == iVar7) {
      iVar7 = s->pos - iVar1;
      if (iVar1 <= s->pos) {
        s->pos = iVar7;
        s->rb_roundtrips = s->rb_roundtrips + 1;
        *(uint *)&s->field_0x304 = (*(uint *)&s->field_0x304 & 0xfffffff7) + (uint)(iVar7 != 0) * 8;
      }
    }
  }
  return BVar8;
}

Assistant:

static BrotliDecoderErrorCode BROTLI_NOINLINE WriteRingBuffer(BrotliDecoderState *s, size_t *available_out,
                                                              uint8_t **next_out, size_t *total_out,
                                                              BROTLI_BOOL force) {
	uint8_t *start = s->ringbuffer + (s->partial_pos_out & (size_t)s->ringbuffer_mask);
	size_t to_write = UnwrittenBytes(s, BROTLI_TRUE);
	size_t num_written = *available_out;
	if (num_written > to_write) {
		num_written = to_write;
	}
	if (s->meta_block_remaining_len < 0) {
		return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_BLOCK_LENGTH_1);
	}
	if (next_out && !*next_out) {
		*next_out = start;
	} else {
		if (next_out) {
			memcpy(*next_out, start, num_written);
			*next_out += num_written;
		}
	}
	*available_out -= num_written;
	BROTLI_LOG_UINT(to_write);
	BROTLI_LOG_UINT(num_written);
	s->partial_pos_out += num_written;
	if (total_out) {
		*total_out = s->partial_pos_out;
	}
	if (num_written < to_write) {
		if (s->ringbuffer_size == (1 << s->window_bits) || force) {
			return BROTLI_DECODER_NEEDS_MORE_OUTPUT;
		} else {
			return BROTLI_DECODER_SUCCESS;
		}
	}
	/* Wrap ring buffer only if it has reached its maximal size. */
	if (s->ringbuffer_size == (1 << s->window_bits) && s->pos >= s->ringbuffer_size) {
		s->pos -= s->ringbuffer_size;
		s->rb_roundtrips++;
		s->should_wrap_ringbuffer = (size_t)s->pos != 0 ? 1 : 0;
	}
	return BROTLI_DECODER_SUCCESS;
}